

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O3

Statement *
slang::ast::ForLoopStatement::fromSyntax
          (Compilation *compilation,ForLoopStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  uint uVar1;
  Scope *this;
  StatementSyntax *pSVar2;
  StatementContext *pSVar3;
  Compilation *this_00;
  bool bVar4;
  int iVar5;
  int iVar6;
  SyntaxNode *pSVar7;
  specific_symbol_iterator<slang::ast::VariableSymbol> sVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ExpressionSyntax *pEVar9;
  SourceLocation SVar10;
  SourceLocation SVar11;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  EVP_PKEY_CTX *src_01;
  size_type extraout_RDX;
  ulong uVar12;
  size_t sVar13;
  byte bVar14;
  iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::VariableSymbol>_> iVar15;
  Expression *stopExpr;
  SmallVector<const_slang::ast::Expression_*,_5UL> steps;
  SmallVector<const_slang::ast::VariableSymbol_*,_5UL> loopVars;
  SmallVector<const_slang::ast::Expression_*,_5UL> initializers;
  UnrollVisitor visitor;
  Expression *local_388;
  StatementContext *local_380;
  Compilation *local_378;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> local_370;
  SmallVectorBase<const_slang::ast::Expression_*> local_360 [2];
  SmallVectorBase<const_slang::ast::VariableSymbol_*> local_320 [2];
  SmallVectorBase<const_slang::ast::Expression_*> local_2e0 [2];
  SourceRange local_2a0;
  UnrollVisitor local_290;
  undefined4 extraout_var_01;
  
  local_2e0[0].data_ = (pointer)local_2e0[0].firstElement;
  bVar14 = 0;
  local_2e0[0].len = 0;
  local_2e0[0].cap = 5;
  local_320[0].data_ = (pointer)local_320[0].firstElement;
  local_320[0].len = 0;
  local_320[0].cap = 5;
  local_380 = stmtCtx;
  local_378 = compilation;
  if ((syntax->initializers).elements.size_ != 0) {
    pSVar7 = slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>::operator[]
                       (&syntax->initializers,0);
    if (pSVar7->kind == ForVariableDeclaration) {
      this = (context->scope).ptr;
      if (this == (Scope *)0x0) {
        assert::assertFailed
                  ("ptr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                   ,0x26,
                   "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]"
                  );
      }
      iVar15 = Scope::membersOfType<slang::ast::VariableSymbol>(this);
      sVar8 = iVar15.m_begin.current;
      if (sVar8.current != iVar15.m_end.current.current) {
        do {
          if ((0x18 < *(int *)sVar8.current - 0x3aU) ||
             ((0x1800c0fU >> (*(int *)sVar8.current - 0x3aU & 0x1f) & 1) == 0)) {
            assert::assertFailed
                      ("T::isKind(kind)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Symbol.h"
                       ,0xc4,
                       "decltype(auto) slang::ast::Symbol::as() [T = slang::ast::VariableSymbol]");
          }
          local_290._0_8_ = sVar8.current;
          SmallVectorBase<slang::ast::VariableSymbol_const*>::
          emplace_back<slang::ast::VariableSymbol_const*>
                    ((SmallVectorBase<slang::ast::VariableSymbol_const*> *)local_320,
                     (VariableSymbol **)&local_290);
          do {
            sVar8.current = *(Symbol **)((long)sVar8.current + 0x28);
            if ((SourceLocation)sVar8.current == (SourceLocation)0x0) {
              sVar8.current = (Symbol *)0x0;
              break;
            }
          } while ((0x18 < *(int *)sVar8.current - 0x3aU) ||
                  ((0x1800c0fU >> (*(int *)sVar8.current - 0x3aU & 0x1f) & 1) == 0));
        } while (sVar8.current != iVar15.m_end.current.current);
      }
    }
    else {
      uVar12 = (syntax->initializers).elements.size_ + 1;
      if (1 < uVar12) {
        bVar14 = 0;
        sVar13 = 0;
        do {
          pSVar7 = slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>::operator[]
                             (&syntax->initializers,sVar13);
          pEVar9 = slang::syntax::SyntaxNode::as<slang::syntax::ExpressionSyntax>(pSVar7);
          SVar11._0_4_ = Expression::bind((int)pEVar9,(sockaddr *)context,0x20);
          SVar11._4_4_ = extraout_var;
          local_290._0_8_ = SVar11;
          SmallVectorBase<slang::ast::Expression_const*>::
          emplace_back<slang::ast::Expression_const*>
                    ((SmallVectorBase<slang::ast::Expression_const*> *)local_2e0,
                     (Expression **)&local_290);
          bVar4 = Expression::bad((Expression *)SVar11);
          bVar14 = bVar14 | bVar4;
          sVar13 = sVar13 + 1;
        } while (uVar12 >> 1 != sVar13);
        goto LAB_0028dfa9;
      }
    }
    bVar14 = 0;
  }
LAB_0028dfa9:
  local_388 = (Expression *)0x0;
  if (syntax->stopExpr != (ExpressionSyntax *)0x0) {
    iVar5 = Expression::bind((int)syntax->stopExpr,(sockaddr *)context,0);
    local_388 = (Expression *)CONCAT44(extraout_var_00,iVar5);
  }
  local_360[0].data_ = (pointer)local_360[0].firstElement;
  local_360[0].len = 0;
  local_360[0].cap = 5;
  uVar12 = (syntax->steps).elements.size_ + 1;
  if (1 < uVar12) {
    sVar13 = 0;
    do {
      pEVar9 = slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::operator[]
                         (&syntax->steps,sVar13);
      SVar10._0_4_ = Expression::bind((int)pEVar9,(sockaddr *)context,0x20);
      SVar10._4_4_ = extraout_var_01;
      local_290._0_8_ = SVar10;
      SmallVectorBase<slang::ast::Expression_const*>::emplace_back<slang::ast::Expression_const*>
                ((SmallVectorBase<slang::ast::Expression_const*> *)local_360,
                 (Expression **)&local_290);
      bVar4 = Expression::bad((Expression *)SVar10);
      bVar14 = bVar14 | bVar4;
      iVar5 = *(int *)SVar10;
      if (iVar5 < 0xe) {
        if ((iVar5 != 0) &&
           ((iVar5 != 10 || (3 < ((Expression *)((long)SVar10 + 0x30))->kind - UnaryOp)))) {
LAB_0028e083:
          bVar14 = 1;
          ASTContext::addDiag(context,(DiagCode)0x1f0008,*(SourceRange *)((long)SVar10 + 0x20));
        }
      }
      else if ((iVar5 != 0xe) && (iVar5 != 0x15)) goto LAB_0028e083;
      sVar13 = sVar13 + 1;
    } while (uVar12 >> 1 != sVar13);
  }
  this_00 = local_378;
  if ((bVar14 != 0) ||
     ((local_388 != (Expression *)0x0 && (bVar4 = Expression::bad(local_388), bVar4)))) {
    local_290._0_8_ = (SourceLocation)0x0;
    SVar11 = (SourceLocation)
             BumpAllocator::emplace<slang::ast::InvalidStatement,slang::ast::Statement_const*&>
                       (&this_00->super_BumpAllocator,(Statement **)&local_290);
  }
  else {
    pSVar3 = local_380;
    uVar1 = (local_380->flags).m_bits;
    (local_380->flags).m_bits = uVar1 | 9;
    pSVar2 = (syntax->statement).ptr;
    if (pSVar2 == (StatementSyntax *)0x0) {
      assert::assertFailed
                ("ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                 ,0x26,
                 "T slang::not_null<slang::syntax::StatementSyntax *>::get() const [T = slang::syntax::StatementSyntax *]"
                );
    }
    iVar5 = Statement::bind((int)pSVar2,(sockaddr *)context,(socklen_t)local_380);
    local_290._0_4_ =
         SmallVectorBase<const_slang::ast::Expression_*>::copy
                   (local_2e0,(EVP_PKEY_CTX *)this_00,src);
    local_290._4_4_ = extraout_var_03;
    iVar6 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                      (local_360,(EVP_PKEY_CTX *)this_00,src_00);
    local_370.data_ = (pointer)CONCAT44(extraout_var_04,iVar6);
    local_2a0 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    SVar11 = (SourceLocation)
             BumpAllocator::
             emplace<slang::ast::ForLoopStatement,nonstd::span_lite::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::ast::Expression_const*&,nonstd::span_lite::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::ast::Statement_const&,slang::SourceRange>
                       (&this_00->super_BumpAllocator,
                        (span<const_slang::ast::Expression_*,_18446744073709551615UL> *)&local_290,
                        &local_388,&local_370,(Statement *)CONCAT44(extraout_var_02,iVar5),
                        &local_2a0);
    iVar6 = SmallVectorBase<const_slang::ast::VariableSymbol_*>::copy
                      (local_320,(EVP_PKEY_CTX *)this_00,src_01);
    ((span<const_slang::ast::VariableSymbol_*const,_18446744073709551615UL> *)((long)SVar11 + 0x30))
    ->data_ = (pointer)CONCAT44(extraout_var_05,iVar6);
    ((span<const_slang::ast::VariableSymbol_*const,_18446744073709551615UL> *)((long)SVar11 + 0x38))
    ->data_ = (pointer)extraout_RDX;
    if (((Statement *)CONCAT44(extraout_var_02,iVar5))->kind == Invalid) {
      local_290._0_8_ = SVar11;
      SVar11 = (SourceLocation)
               BumpAllocator::emplace<slang::ast::InvalidStatement,slang::ast::Statement_const*&>
                         (&this_00->super_BumpAllocator,(Statement **)&local_290);
    }
    else if (((uVar1 & 8) == 0) && ((this_00->options).strictDriverChecking == false)) {
      UnrollVisitor::UnrollVisitor(&local_290,context);
      SVar10 = SVar11;
      UnrollVisitor::handle(&local_290,(ForLoopStatement *)SVar11);
      SmallVectorBase<slang::Diagnostic>::cleanup
                ((SmallVectorBase<slang::Diagnostic> *)&local_290.evalCtx.diags,
                 (EVP_PKEY_CTX *)SVar10);
      if ((SourceLocation *)
          local_290.evalCtx.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.data_ !=
          (SourceLocation *)
          local_290.evalCtx.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.firstElement) {
        free(local_290.evalCtx.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.data_);
      }
      SmallVectorBase<slang::ast::EvalContext::Frame>::cleanup
                ((SmallVectorBase<slang::ast::EvalContext::Frame> *)&local_290.evalCtx.stack,
                 (EVP_PKEY_CTX *)SVar10);
    }
    (pSVar3->flags).m_bits = uVar1 & 9 | (pSVar3->flags).m_bits & 0x16;
  }
  if (local_360[0].data_ != (pointer)local_360[0].firstElement) {
    free(local_360[0].data_);
  }
  if (local_320[0].data_ != (pointer)local_320[0].firstElement) {
    free(local_320[0].data_);
  }
  if (local_2e0[0].data_ != (pointer)local_2e0[0].firstElement) {
    free(local_2e0[0].data_);
  }
  return (Statement *)SVar11;
}

Assistant:

Statement& ForLoopStatement::fromSyntax(Compilation& compilation,
                                        const ForLoopStatementSyntax& syntax,
                                        const ASTContext& context, StatementContext& stmtCtx) {
    SmallVector<const Expression*> initializers;
    SmallVector<const VariableSymbol*> loopVars;
    bool anyBad = false;

    const bool hasVarDecls = !syntax.initializers.empty() &&
                             syntax.initializers[0]->kind == SyntaxKind::ForVariableDeclaration;
    if (hasVarDecls) {
        // The block should have already been created for us containing the
        // variable declarations.
        for (auto& var : context.scope->membersOfType<VariableSymbol>())
            loopVars.push_back(&var);
    }
    else {
        for (auto initializer : syntax.initializers) {
            auto& init = Expression::bind(initializer->as<ExpressionSyntax>(), context,
                                          ASTFlags::AssignmentAllowed);
            initializers.push_back(&init);
            anyBad |= init.bad();
        }
    }

    const Expression* stopExpr = nullptr;
    if (syntax.stopExpr)
        stopExpr = &Expression::bind(*syntax.stopExpr, context);

    SmallVector<const Expression*> steps;
    for (auto step : syntax.steps) {
        auto& expr = Expression::bind(*step, context, ASTFlags::AssignmentAllowed);
        steps.push_back(&expr);
        anyBad |= expr.bad();

        bool stepOk;
        switch (expr.kind) {
            case ExpressionKind::Invalid:
            case ExpressionKind::Assignment:
            case ExpressionKind::Call:
                stepOk = true;
                break;
            case ExpressionKind::UnaryOp: {
                auto op = expr.as<UnaryExpression>().op;
                stepOk = op == UnaryOperator::Preincrement || op == UnaryOperator::Postincrement ||
                         op == UnaryOperator::Predecrement || op == UnaryOperator::Postdecrement;
                break;
            }
            default:
                stepOk = false;
                break;
        }

        if (!stepOk) {
            anyBad = true;
            context.addDiag(diag::InvalidForStepExpression, expr.sourceRange);
        }
    }

    if (anyBad || (stopExpr && stopExpr->bad()))
        return badStmt(compilation, nullptr);

    // For purposes of checking for multiple drivers to variables, we want to
    // "unroll" this for loop if possible to allow finer grained checking of
    // longest static prefixes involving the loop variables(s).
    const bool wasFirst = !stmtCtx.flags.has(StatementFlags::InForLoop);
    auto guard = stmtCtx.enterLoop(true);
    auto& bodyStmt = Statement::bind(*syntax.statement, context, stmtCtx);

    auto result = compilation.emplace<ForLoopStatement>(initializers.copy(compilation), stopExpr,
                                                        steps.copy(compilation), bodyStmt,
                                                        syntax.sourceRange());
    result->loopVars = loopVars.copy(compilation);

    if (bodyStmt.bad())
        return badStmt(compilation, result);

    // If this is the top-level unrollable for loop, attempt the unrolling now.
    // If not top-level, just pop up the stack and let the parent loop handle us.
    if (wasFirst && !compilation.getOptions().strictDriverChecking) {
        UnrollVisitor visitor(context);
        visitor.visit(*result);
    }

    return *result;
}